

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_115a7f3::HandleImportedRuntimeArtifactsMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  _Any_data *p_Var1;
  pointer pcVar2;
  cmInstallCommandArguments *typeArgs;
  cmMakefile *this;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  TargetType TVar7;
  uint uVar8;
  int iVar9;
  cmArgumentParser<void> *this_00;
  string *psVar10;
  cmGlobalGenerator *pcVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  cmTarget **ppcVar13;
  undefined8 name;
  cmInstallImportedRuntimeArtifactsGenerator *library;
  cmInstallImportedRuntimeArtifactsGenerator *executable;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  static_string_view name_00;
  static_string_view name_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  cmTarget *target;
  Helper helper;
  anon_class_48_1_585e00ec createInstallGenerator;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  string runtimeDependencySetArg;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targetList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genericArgVector;
  ArgVectors argVectors;
  cmInstallCommandArguments genericArgs;
  cmInstallCommandArguments bundleArgs;
  cmInstallCommandArguments frameworkArgs;
  cmInstallCommandArguments runtimeArgs;
  cmInstallCommandArguments libraryArgs;
  undefined1 local_c68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c48;
  byte local_c34;
  byte local_c33;
  byte local_c32;
  byte local_c31;
  undefined1 local_c30 [32];
  undefined1 local_c10 [16];
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_c00;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_bf8;
  Helper local_bf0;
  ulong local_bc0;
  undefined1 local_bb8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  undefined8 local_b78;
  cmTarget **local_b68;
  iterator iStack_b60;
  cmTarget **local_b58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b08;
  undefined8 local_af8;
  cmTarget **local_ae8;
  cmTarget **local_ae0;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  undefined1 local_a38 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_a00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_9d0;
  ParseResult local_9b8;
  ParseResult local_988;
  ParseResult local_958;
  ParseResult local_928;
  ParseResult local_8f8;
  cmInstallCommandArguments local_8c8;
  cmInstallCommandArguments local_710;
  cmInstallCommandArguments local_558;
  cmInstallCommandArguments local_3a0;
  cmInstallCommandArguments local_1e8;
  
  Helper::Helper(&local_bf0,status);
  local_b68 = (cmTarget **)0x0;
  iStack_b60._M_current = (cmTarget **)0x0;
  local_b58 = (cmTarget **)0x0;
  if (((anonymous_namespace)::
       HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::argHelper == '\0') &&
     (iVar9 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::argHelper), iVar9 != 0)) {
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker =
         (_Invoker_type)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_functor._8_8_ = 0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_manager = (_Manager_type)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue._M_invoker =
         (_Invoker_type)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_functor._M_unused._M_object = (void *)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
    super__Function_base._M_functor._8_8_ = 0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
    super__Function_base._M_manager = (_Manager_type)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
    super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    name_02.super_string_view._M_str = "LIBRARY";
    name_02.super_string_view._M_len = 7;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&local_8c8,name_02,0);
    name_03.super_string_view._M_str = "RUNTIME";
    name_03.super_string_view._M_len = 7;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&local_8c8,name_03,0x18);
    name_04.super_string_view._M_str = "FRAMEWORK";
    name_04.super_string_view._M_len = 9;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&local_8c8,name_04,0x30);
    name_05.super_string_view._M_str = "BUNDLE";
    name_05.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&local_8c8,name_05,0x48);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleImportedRuntimeArtifactsMode::argHelper,(ActionMap *)&local_8c8);
    ArgumentParser::Base::~Base((Base *)&local_8c8);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleImportedRuntimeArtifactsMode::argHelper,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::argHelper);
  }
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a38;
  local_a38._0_8_ = (pointer)0x0;
  local_a38._8_8_ = (pointer)0x0;
  local_a38._16_8_ = (pointer)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
  super__Function_base._M_functor._M_unused._0_8_ = (undefined8)(local_a38 + 0x20);
  vStack_9d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_9d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_9d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_a00.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_a00.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_a00.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&HandleImportedRuntimeArtifactsMode::argHelper;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
  super__Function_base._M_functor._8_8_ = 0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
  super__Function_base._M_manager = (_Manager_type)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue._M_invoker =
       (_Invoker_type)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
  _M_functor._M_unused._M_object = (void *)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
  _M_functor._8_8_ = 0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
  _M_manager = (_Manager_type)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker =
       (_Invoker_type)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
                        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                        .
                        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)&local_8c8,args,0);
  if (local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker !=
      (_Invoker_type)0x0) {
    p_Var1 = (_Any_data *)
             ((long)&local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.
                     super__Function_base._M_functor + 8);
    (*local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker)
              (p_Var1,p_Var1,__destroy_functor);
  }
  local_af8 = 0;
  local_b08._M_allocated_capacity = 0;
  local_b08._8_8_ = (string *)0x0;
  local_b28._M_allocated_capacity = (size_type)&local_b18;
  local_b28._8_8_ = 0;
  local_b18._M_local_buf[0] = '\0';
  local_b48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a58,local_bf0.DefaultComponentName._M_dataplus._M_p,
             local_bf0.DefaultComponentName._M_dataplus._M_p +
             local_bf0.DefaultComponentName._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_8c8,&local_a58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  name_00.super_string_view._M_str = "IMPORTED_RUNTIME_ARTIFACTS";
  name_00.super_string_view._M_len = 0x1a;
  this_00 = cmArgumentParser<void>::
            Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (&local_8c8.super_cmArgumentParser<void>,name_00,
                       (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_b08);
  name_01.super_string_view._M_str = "RUNTIME_DEPENDENCY_SET";
  name_01.super_string_view._M_len = 0x16;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (this_00,name_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b28);
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_8f8,&local_8c8.super_cmArgumentParser<void>,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a38,&local_b48,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_8f8);
  bVar4 = cmInstallCommandArguments::Finalize(&local_8c8);
  local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a78,local_bf0.DefaultComponentName._M_dataplus._M_p,
             local_bf0.DefaultComponentName._M_dataplus._M_p +
             local_bf0.DefaultComponentName._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_1e8,&local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
    operator_delete(local_a78._M_dataplus._M_p,local_a78.field_2._M_allocated_capacity + 1);
  }
  local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a98,local_bf0.DefaultComponentName._M_dataplus._M_p,
             local_bf0.DefaultComponentName._M_dataplus._M_p +
             local_bf0.DefaultComponentName._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_3a0,&local_a98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
    operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
  }
  local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ab8,local_bf0.DefaultComponentName._M_dataplus._M_p,
             local_bf0.DefaultComponentName._M_dataplus._M_p +
             local_bf0.DefaultComponentName._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_558,&local_ab8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
    operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
  }
  local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ad8,local_bf0.DefaultComponentName._M_dataplus._M_p,
             local_bf0.DefaultComponentName._M_dataplus._M_p +
             local_bf0.DefaultComponentName._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_710,&local_ad8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
    operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
  }
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_928,&local_1e8.super_cmArgumentParser<void>,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_a38 + 0x20),&local_b48,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_928);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_958,&local_3a0.super_cmArgumentParser<void>,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vStack_a00,&local_b48,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_958);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_988,&local_558.super_cmArgumentParser<void>,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_9e8,&local_b48,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_988);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_9b8,&local_710.super_cmArgumentParser<void>,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vStack_9d0,&local_b48,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_9b8);
  if (local_b48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_b48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_710.GenericArguments = &local_8c8;
    local_558.GenericArguments = &local_8c8;
    local_3a0.GenericArguments = &local_8c8;
    local_1e8.GenericArguments = &local_8c8;
    if ((((bVar4) && (bVar4 = cmInstallCommandArguments::Finalize(&local_1e8), bVar4)) &&
        (bVar4 = cmInstallCommandArguments::Finalize(&local_3a0), bVar4)) &&
       ((bVar4 = cmInstallCommandArguments::Finalize(&local_558), bVar4 &&
        (bVar4 = cmInstallCommandArguments::Finalize(&local_710), bVar4)))) {
      if (local_b28._8_8_ == 0) {
        local_c30._16_8_ = (cmInstallRuntimeDependencySet *)0x0;
      }
      else {
        this = (cmMakefile *)CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_);
        local_c68._0_8_ = local_c68 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c68,"CMAKE_HOST_SYSTEM_NAME","");
        psVar10 = cmMakefile::GetSafeDefinition(this,(string *)local_c68);
        pcVar2 = (psVar10->_M_dataplus)._M_p;
        local_bb8._0_8_ = &((string *)local_bb8)->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_bb8,pcVar2,pcVar2 + psVar10->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c68._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_c68 + 0x10)) {
          operator_delete((void *)local_c68._0_8_,(ulong)(local_c68._16_8_ + 1));
        }
        bVar4 = cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies((string *)local_bb8)
        ;
        if (bVar4) {
          pcVar11 = cmMakefile::GetGlobalGenerator
                              ((cmMakefile *)
                               CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_));
          local_c30._16_8_ =
               cmGlobalGenerator::GetNamedRuntimeDependencySet(pcVar11,(string *)&local_b28);
        }
        else {
          local_c30[0] = 0x22;
          cmStrCat<char_const(&)[79],std::__cxx11::string&,char>
                    ((string *)local_c68,
                     (char (*) [79])
                     "IMPORTED_RUNTIME_ARTIFACTS RUNTIME_DEPENDENCY_SET is not supported on system \""
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bb8
                     ,local_c30);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c68._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_c68 + 0x10)) {
            operator_delete((void *)local_c68._0_8_,(ulong)(local_c68._16_8_ + 1));
          }
          local_c30._16_8_ = (cmInstallRuntimeDependencySet *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_bb8._0_8_ != &((string *)local_bb8)->field_2) {
          operator_delete((void *)local_bb8._0_8_,(ulong)(local_ba8._M_allocated_capacity + 1));
        }
        if (!bVar4) goto LAB_00391d3c;
      }
      uVar3 = local_b08._8_8_;
      name = local_b08._M_allocated_capacity;
      if (local_b08._M_allocated_capacity == local_b08._8_8_) {
        bVar4 = true;
      }
      else {
        do {
          bVar4 = cmMakefile::IsAlias((cmMakefile *)
                                      CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_),
                                      (string *)name);
          if (bVar4) {
            cmStrCat<char_const(&)[42],std::__cxx11::string_const&,char_const(&)[21]>
                      ((string *)local_bb8,
                       (char (*) [42])"IMPORTED_RUNTIME_ARTIFACTS given target \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,
                       (char (*) [21])"\" which is an alias.");
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00391d1e:
            local_c68._16_8_ = local_ba8._M_allocated_capacity;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bb8._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_bb8._0_8_ != &((string *)local_bb8)->field_2) goto LAB_003911c5;
            goto LAB_00391d3c;
          }
          local_c68._0_8_ =
               cmMakefile::FindTargetToUse
                         ((cmMakefile *)CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_),
                          (string *)name,false);
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c68._0_8_ ==
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) || (bVar4 = cmTarget::IsImported((cmTarget *)local_c68._0_8_), !bVar4)) {
            pcVar11 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)
                                 CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_));
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)cmGlobalGenerator::FindTarget(pcVar11,(string *)name,true);
            if ((paVar12 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) &&
               (bVar4 = cmTarget::IsImported((cmTarget *)&paVar12->_M_allocated_capacity), bVar4)) {
              local_c68._0_8_ = paVar12;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c68._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            cmStrCat<char_const(&)[42],std::__cxx11::string_const&,char_const(&)[24]>
                      ((string *)local_bb8,
                       (char (*) [42])"IMPORTED_RUNTIME_ARTIFACTS given target \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,
                       (char (*) [24])"\" which does not exist.");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00391d1e;
          }
          TVar7 = cmTarget::GetType((cmTarget *)local_c68._0_8_);
          if (((TVar7 != EXECUTABLE) &&
              (TVar7 = cmTarget::GetType((cmTarget *)local_c68._0_8_), TVar7 != SHARED_LIBRARY)) &&
             (TVar7 = cmTarget::GetType((cmTarget *)local_c68._0_8_), TVar7 != MODULE_LIBRARY)) {
            cmStrCat<char_const(&)[42],std::__cxx11::string_const&,char_const(&)[50]>
                      ((string *)local_bb8,
                       (char (*) [42])"IMPORTED_RUNTIME_ARTIFACTS given target \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,
                       (char (*) [50])"\" which is not an executable, library, or module.");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00391d1e;
          }
          if (iStack_b60._M_current == local_b58) {
            std::vector<cmTarget*,std::allocator<cmTarget*>>::_M_realloc_insert<cmTarget*const&>
                      ((vector<cmTarget*,std::allocator<cmTarget*>> *)&local_b68,iStack_b60,
                       (cmTarget **)local_c68);
          }
          else {
            *iStack_b60._M_current = (cmTarget *)local_c68._0_8_;
            iStack_b60._M_current = iStack_b60._M_current + 1;
          }
          name = name + 0x20;
        } while (name != uVar3);
        local_bb8._4_4_ = local_bf0.Status._4_4_;
        local_bb8._0_4_ = local_bf0.Status._0_4_;
        local_bb8._12_4_ = local_bf0.Makefile._4_4_;
        local_bb8._8_4_ = local_bf0.Makefile._0_4_;
        local_ba8._M_allocated_capacity = (size_type)&local_b98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&((string *)local_bb8)->field_2,
                   local_bf0.DefaultComponentName._M_dataplus._M_p,
                   local_bf0.DefaultComponentName._M_dataplus._M_p +
                   local_bf0.DefaultComponentName._M_string_length);
        local_ae8 = iStack_b60._M_current;
        bVar4 = local_b68 == iStack_b60._M_current;
        if (bVar4) {
          local_c30._8_4_ = 0;
          local_c30._12_4_ = 0;
          local_bc0 = 0;
          uVar8 = 0;
        }
        else {
          local_bc0 = 0;
          local_c30._12_4_ = 0;
          local_c30._8_4_ = 0;
          local_c30._28_4_ = 0;
          ppcVar13 = local_b68;
          do {
            typeArgs = (cmInstallCommandArguments *)*ppcVar13;
            local_ae0 = ppcVar13;
            TVar7 = cmTarget::GetType((cmTarget *)typeArgs);
            if (TVar7 == EXECUTABLE) {
              bVar5 = cmTarget::IsAppBundleOnApple((cmTarget *)typeArgs);
              if (!bVar5) {
                (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
                          ((string *)local_c68,&local_bf0,&local_3a0);
                HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                          ((anon_class_48_1_585e00ec *)local_c30,(cmTarget *)local_bb8,typeArgs,
                           (string *)&local_3a0);
                executable = (cmInstallImportedRuntimeArtifactsGenerator *)local_c30._0_8_;
                local_c30._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c68._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_c68 + 0x10)) {
                  operator_delete((void *)local_c68._0_8_,(ulong)(local_c68._16_8_ + 1));
                }
                if ((cmInstallRuntimeDependencySet *)local_c30._16_8_ ==
                    (cmInstallRuntimeDependencySet *)0x0) {
LAB_00391863:
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  goto LAB_003918f1;
                }
                library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
                cmInstallRuntimeDependencySet::AddExecutable
                          ((cmInstallRuntimeDependencySet *)local_c30._16_8_,executable);
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
                goto LAB_003918f6;
              }
              psVar10 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_710);
              if (psVar10->_M_string_length != 0) {
                cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_710);
                HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                          ((anon_class_48_1_585e00ec *)local_c68,(cmTarget *)local_bb8,typeArgs,
                           (string *)&local_710);
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c68._0_8_;
                if ((cmInstallRuntimeDependencySet *)local_c30._16_8_ ==
                    (cmInstallRuntimeDependencySet *)0x0) {
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  executable = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                }
                else {
                  bVar6 = (anonymous_namespace)::
                          AddBundleExecutable<cmInstallImportedRuntimeArtifactsGenerator*>
                                    (&local_bf0,(cmInstallRuntimeDependencySet *)local_c30._16_8_,
                                     (cmInstallImportedRuntimeArtifactsGenerator **)local_c68);
                  bVar5 = false;
                  if (!bVar6) goto LAB_00391a55;
                  executable = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                }
                goto LAB_003918f6;
              }
              psVar10 = cmTarget::GetName_abi_cxx11_((cmTarget *)typeArgs);
              cmStrCat<char_const(&)[93],std::__cxx11::string_const&,char_const(&)[3]>
                        ((string *)local_c68,
                         (char (*) [93])
                         "IMPORTED_RUNTIME_ARTIFACTS given no BUNDLE DESTINATION for MACOSX_BUNDLE executable target \""
                         ,psVar10,(char (*) [3])0x830240);
              std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00391b34:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c68._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_c68 + 0x10)) {
                operator_delete((void *)local_c68._0_8_,(ulong)(local_c68._16_8_ + 1));
              }
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
              bVar5 = false;
            }
            else {
              if (TVar7 == SHARED_LIBRARY) {
                bVar5 = cmTarget::IsDLLPlatform((cmTarget *)typeArgs);
                if (bVar5) {
                  (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
                            ((string *)local_c68,&local_bf0,&local_3a0);
                  HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                            ((anon_class_48_1_585e00ec *)local_c30,(cmTarget *)local_bb8,typeArgs,
                             (string *)&local_3a0);
                  executable = (cmInstallImportedRuntimeArtifactsGenerator *)local_c30._0_8_;
                  local_c30._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c68._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_c68 + 0x10)) {
                    operator_delete((void *)local_c68._0_8_,(ulong)(local_c68._16_8_ + 1));
                  }
                  if ((cmInstallRuntimeDependencySet *)local_c30._16_8_ ==
                      (cmInstallRuntimeDependencySet *)0x0) goto LAB_00391863;
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                  cmInstallRuntimeDependencySet::AddLibrary
                            ((cmInstallRuntimeDependencySet *)local_c30._16_8_,executable);
                  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                }
                else {
                  bVar5 = cmTarget::IsFrameworkOnApple((cmTarget *)typeArgs);
                  if (bVar5) {
                    psVar10 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_558);
                    if (psVar10->_M_string_length == 0) {
                      psVar10 = cmTarget::GetName_abi_cxx11_((cmTarget *)typeArgs);
                      cmStrCat<char_const(&)[96],std::__cxx11::string_const&,char_const(&)[3]>
                                ((string *)local_c68,
                                 (char (*) [96])
                                 "IMPORTED_RUNTIME_ARTIFACTS given no FRAMEWORK DESTINATION for shared library FRAMEWORK target \""
                                 ,psVar10,(char (*) [3])0x830240);
                      std::__cxx11::string::_M_assign((string *)&status->Error);
                      goto LAB_00391b34;
                    }
                    cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_558);
                    HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                              ((anon_class_48_1_585e00ec *)local_c68,(cmTarget *)local_bb8,typeArgs,
                               (string *)&local_558);
                    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_c68._0_8_;
                    if ((cmInstallRuntimeDependencySet *)local_c30._16_8_ ==
                        (cmInstallRuntimeDependencySet *)0x0) {
                      library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                      executable = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                      goto LAB_003918f4;
                    }
                    library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                    executable = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                    cmInstallRuntimeDependencySet::AddLibrary
                              ((cmInstallRuntimeDependencySet *)local_c30._16_8_,
                               (cmInstallImportedRuntimeArtifactsGenerator *)local_c68._0_8_);
                    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0;
                  }
                  else {
                    (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
                              ((string *)local_c68,&local_bf0,&local_1e8);
                    HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                              ((anon_class_48_1_585e00ec *)local_c30,(cmTarget *)local_bb8,typeArgs,
                               (string *)&local_1e8);
                    library = (cmInstallImportedRuntimeArtifactsGenerator *)local_c30._0_8_;
                    local_c30._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c68._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_c68 + 0x10)) {
                      operator_delete((void *)local_c68._0_8_,(ulong)(local_c68._16_8_ + 1));
                    }
                    if ((cmInstallRuntimeDependencySet *)local_c30._16_8_ ==
                        (cmInstallRuntimeDependencySet *)0x0) goto LAB_003918ee;
                    executable = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0;
                    cmInstallRuntimeDependencySet::AddLibrary
                              ((cmInstallRuntimeDependencySet *)local_c30._16_8_,library);
                    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0;
                  }
                }
              }
              else {
                if (TVar7 != MODULE_LIBRARY) {
                  __assert_fail("false && \"This should never happen\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallCommand.cxx"
                                ,0x5df,
                                "bool (anonymous namespace)::HandleImportedRuntimeArtifactsMode(const std::vector<std::string> &, cmExecutionStatus &)"
                               );
                }
                (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
                          ((string *)local_c68,&local_bf0,&local_1e8);
                HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                          ((anon_class_48_1_585e00ec *)local_c30,(cmTarget *)local_bb8,typeArgs,
                           (string *)&local_1e8);
                library = (cmInstallImportedRuntimeArtifactsGenerator *)local_c30._0_8_;
                local_c30._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c68._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_c68 + 0x10)) {
                  operator_delete((void *)local_c68._0_8_,(ulong)(local_c68._16_8_ + 1));
                }
                if ((cmInstallRuntimeDependencySet *)local_c30._16_8_ ==
                    (cmInstallRuntimeDependencySet *)0x0) {
LAB_003918ee:
                  executable = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
LAB_003918f1:
                  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
LAB_003918f4:
                  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                }
                else {
                  executable = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                  cmInstallRuntimeDependencySet::AddModule
                            ((cmInstallRuntimeDependencySet *)local_c30._16_8_,library);
                  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                }
              }
LAB_003918f6:
              local_c34 = library != (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              local_c33 = executable != (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              local_c32 = paVar14 !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
              local_c31 = paVar12 !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
              local_c48._M_allocated_capacity = (size_type)executable;
              local_c48._8_8_ = paVar14;
              local_bf8._M_head_impl = &library->super_cmInstallGenerator;
              cmMakefile::AddInstallGenerator
                        ((cmMakefile *)CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_),
                         (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *
                         )&local_bf8);
              if ((cmInstallImportedRuntimeArtifactsGenerator *)local_bf8._M_head_impl !=
                  (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
                (*(((cmInstallGenerator *)&(local_bf8._M_head_impl)->super_cmScriptGenerator)->
                  super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
              }
              local_bf8._M_head_impl = (cmInstallGenerator *)0x0;
              local_c00._M_head_impl = (cmInstallGenerator *)local_c48._M_allocated_capacity;
              cmMakefile::AddInstallGenerator
                        ((cmMakefile *)CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_),
                         (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *
                         )&local_c00);
              if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c00._M_head_impl !=
                  (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
                (*(((cmInstallGenerator *)&(local_c00._M_head_impl)->super_cmScriptGenerator)->
                  super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
              }
              local_c00._M_head_impl = (cmInstallGenerator *)0x0;
              local_c10._8_8_ = local_c48._8_8_;
              cmMakefile::AddInstallGenerator
                        ((cmMakefile *)CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_),
                         (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *
                         )(local_c10 + 8));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c10._8_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_c10._8_8_ + 8))();
              }
              local_c10._8_8_ = 0;
              local_c10._0_8_ = paVar12;
              cmMakefile::AddInstallGenerator
                        ((cmMakefile *)CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_),
                         (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *
                         )local_c10);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c10._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_c10._0_8_ + 8))();
              }
              local_c30._28_4_ =
                   CONCAT31(SUB43(local_c30._28_4_,1),(byte)local_c30._28_4_ | local_c34) &
                   0xffffff01;
              local_c30._8_4_ =
                   CONCAT31(SUB43(local_c30._8_4_,1),(byte)local_c30._8_4_ | local_c33) & 0xffffff01
              ;
              local_c30._12_4_ =
                   CONCAT31(SUB43(local_c30._12_4_,1),(byte)local_c30._12_4_ | local_c32) &
                   0xffffff01;
              local_bc0 = CONCAT71((int7)(local_bc0 >> 8),(byte)local_bc0 | local_c31) &
                          0xffffffffffffff01;
              local_c10._0_8_ = 0;
              bVar5 = true;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            }
LAB_00391a55:
            if (paVar12 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(paVar12->_M_allocated_capacity + 8))();
            }
            uVar8 = local_c30._28_4_;
            if (!bVar5) break;
            ppcVar13 = local_ae0 + 1;
            bVar4 = ppcVar13 == local_ae8;
          } while (!bVar4);
        }
        if (bVar4) {
          if ((uVar8 & 1) != 0) {
            pcVar11 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)
                                 CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_));
            psVar10 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_1e8);
            cmGlobalGenerator::AddInstallComponent(pcVar11,psVar10);
          }
          if ((local_c30._8_4_ & 1) != 0) {
            pcVar11 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)
                                 CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_));
            psVar10 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_3a0);
            cmGlobalGenerator::AddInstallComponent(pcVar11,psVar10);
          }
          if ((local_c30._12_4_ & 1) != 0) {
            pcVar11 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)
                                 CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_));
            psVar10 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_558);
            cmGlobalGenerator::AddInstallComponent(pcVar11,psVar10);
          }
          if ((local_bc0 & 1) != 0) {
            pcVar11 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)
                                 CONCAT44(local_bf0.Makefile._4_4_,local_bf0.Makefile._0_4_));
            psVar10 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_710);
            cmGlobalGenerator::AddInstallComponent(pcVar11,psVar10);
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_ba8._M_allocated_capacity != &local_b98) {
          operator_delete((void *)local_ba8._M_allocated_capacity,
                          (ulong)(local_b98._M_dataplus._M_p + 1));
        }
      }
      goto LAB_00391d3e;
    }
  }
  else {
    local_bb8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x33;
    local_bb8._8_8_ = "IMPORTED_RUNTIME_ARTIFACTS given unknown argument \"";
    local_ba8._M_allocated_capacity = 0;
    local_b98._M_dataplus._M_p =
         ((local_b48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_ba8._8_8_ =
         (local_b48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_b98._M_string_length = 0;
    local_b98.field_2._0_8_ = 2;
    local_b98.field_2._8_8_ = (long)"Parse error.  Function missing opening \"(\"." + 0x29;
    local_b78 = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_bb8;
    cmCatViews((string *)local_c68,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c68._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c68._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_c68 + 0x10)) {
LAB_003911c5:
      operator_delete(paVar12,(ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_c68._16_8_)->_M_dataplus)._M_p + 1));
    }
  }
LAB_00391d3c:
  bVar4 = false;
LAB_00391d3e:
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_710);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_558);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_3a0);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_1e8);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_8c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_allocated_capacity != &local_b18) {
    operator_delete((void *)local_b28._M_allocated_capacity,
                    CONCAT71(local_b18._M_allocated_capacity._1_7_,local_b18._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_b08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_9d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_a00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_a38 + 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a38);
  if (local_b68 != (cmTarget **)0x0) {
    operator_delete(local_b68,(long)local_b58 - (long)local_b68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf0.DefaultComponentName._M_dataplus._M_p != &local_bf0.DefaultComponentName.field_2)
  {
    operator_delete(local_bf0.DefaultComponentName._M_dataplus._M_p,
                    local_bf0.DefaultComponentName.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool HandleImportedRuntimeArtifactsMode(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the IMPORTED_RUNTIME_ARTIFACTS mode.
  std::vector<cmTarget*> targets;

  struct ArgVectors
  {
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Library;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Runtime;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Framework;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Bundle;
  };

  static auto const argHelper = cmArgumentParser<ArgVectors>{}
                                  .Bind("LIBRARY"_s, &ArgVectors::Library)
                                  .Bind("RUNTIME"_s, &ArgVectors::Runtime)
                                  .Bind("FRAMEWORK"_s, &ArgVectors::Framework)
                                  .Bind("BUNDLE"_s, &ArgVectors::Bundle);

  std::vector<std::string> genericArgVector;
  ArgVectors const argVectors = argHelper.Parse(args, &genericArgVector);

  // now parse the generic args (i.e. the ones not specialized on LIBRARY,
  // RUNTIME etc. (see above)
  ArgumentParser::MaybeEmpty<std::vector<std::string>> targetList;
  std::string runtimeDependencySetArg;
  std::vector<std::string> unknownArgs;
  cmInstallCommandArguments genericArgs(helper.DefaultComponentName);
  genericArgs.Bind("IMPORTED_RUNTIME_ARTIFACTS"_s, targetList)
    .Bind("RUNTIME_DEPENDENCY_SET"_s, runtimeDependencySetArg);
  genericArgs.Parse(genericArgVector, &unknownArgs);
  bool success = genericArgs.Finalize();

  cmInstallCommandArguments libraryArgs(helper.DefaultComponentName);
  cmInstallCommandArguments runtimeArgs(helper.DefaultComponentName);
  cmInstallCommandArguments frameworkArgs(helper.DefaultComponentName);
  cmInstallCommandArguments bundleArgs(helper.DefaultComponentName);

  // now parse the args for specific parts of the target (e.g. LIBRARY,
  // RUNTIME etc.
  libraryArgs.Parse(argVectors.Library, &unknownArgs);
  runtimeArgs.Parse(argVectors.Runtime, &unknownArgs);
  frameworkArgs.Parse(argVectors.Framework, &unknownArgs);
  bundleArgs.Parse(argVectors.Bundle, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given unknown argument \"",
               unknownArgs[0], "\"."));
    return false;
  }

  // apply generic args
  libraryArgs.SetGenericArguments(&genericArgs);
  runtimeArgs.SetGenericArguments(&genericArgs);
  frameworkArgs.SetGenericArguments(&genericArgs);
  bundleArgs.SetGenericArguments(&genericArgs);

  success = success && libraryArgs.Finalize();
  success = success && runtimeArgs.Finalize();
  success = success && frameworkArgs.Finalize();
  success = success && bundleArgs.Finalize();

  if (!success) {
    return false;
  }

  cmInstallRuntimeDependencySet* runtimeDependencySet = nullptr;
  if (!runtimeDependencySetArg.empty()) {
    auto system = helper.Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
    if (!cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(
          system)) {
      status.SetError(
        cmStrCat("IMPORTED_RUNTIME_ARTIFACTS RUNTIME_DEPENDENCY_SET is not "
                 "supported on system \"",
                 system, '"'));
      return false;
    }
    runtimeDependencySet =
      helper.Makefile->GetGlobalGenerator()->GetNamedRuntimeDependencySet(
        runtimeDependencySetArg);
  }

  // Check if there is something to do.
  if (targetList.empty()) {
    return true;
  }

  for (std::string const& tgt : targetList) {
    if (helper.Makefile->IsAlias(tgt)) {
      status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"",
                               tgt, "\" which is an alias."));
      return false;
    }
    // Lookup this target in the current directory.
    cmTarget* target = helper.Makefile->FindTargetToUse(tgt);
    if (!target || !target->IsImported()) {
      // If no local target has been found, find it in the global scope.
      cmTarget* const global_target =
        helper.Makefile->GetGlobalGenerator()->FindTarget(tgt, true);
      if (global_target && global_target->IsImported()) {
        target = global_target;
      }
    }
    if (target) {
      // Found the target.  Check its type.
      if (target->GetType() != cmStateEnums::EXECUTABLE &&
          target->GetType() != cmStateEnums::SHARED_LIBRARY &&
          target->GetType() != cmStateEnums::MODULE_LIBRARY) {
        status.SetError(
          cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"", tgt,
                   "\" which is not an executable, library, or module."));
        return false;
      }
      // Store the target in the list to be installed.
      targets.push_back(target);
    } else {
      // Did not find the target.
      status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"",
                               tgt, "\" which does not exist."));
      return false;
    }
  }

  // Keep track of whether we will be performing an installation of
  // any files of the given type.
  bool installsLibrary = false;
  bool installsRuntime = false;
  bool installsFramework = false;
  bool installsBundle = false;

  auto const createInstallGenerator =
    [helper](cmTarget& target, const cmInstallCommandArguments& typeArgs,
             const std::string& destination)
    -> std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator> {
    return cm::make_unique<cmInstallImportedRuntimeArtifactsGenerator>(
      target.GetName(), destination, typeArgs.GetPermissions(),
      typeArgs.GetConfigurations(), typeArgs.GetComponent(),
      cmInstallGenerator::SelectMessageLevel(helper.Makefile),
      typeArgs.GetExcludeFromAll(), typeArgs.GetOptional(),
      helper.Makefile->GetBacktrace());
  };

  // Generate install script code to install the given targets.
  for (cmTarget* ti : targets) {
    // Handle each target type.
    cmTarget& target = *ti;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      libraryGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      runtimeGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      frameworkGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      bundleGenerator;

    switch (target.GetType()) {
      case cmStateEnums::SHARED_LIBRARY:
        if (target.IsDLLPlatform()) {
          runtimeGenerator = createInstallGenerator(
            target, runtimeArgs, helper.GetRuntimeDestination(&runtimeArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(runtimeGenerator.get());
          }
        } else if (target.IsFrameworkOnApple()) {
          if (frameworkArgs.GetDestination().empty()) {
            status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given no "
                                     "FRAMEWORK DESTINATION for shared "
                                     "library FRAMEWORK target \"",
                                     target.GetName(), "\"."));
            return false;
          }
          frameworkGenerator = createInstallGenerator(
            target, frameworkArgs, frameworkArgs.GetDestination());
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(frameworkGenerator.get());
          }
        } else {
          libraryGenerator = createInstallGenerator(
            target, libraryArgs, helper.GetLibraryDestination(&libraryArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(libraryGenerator.get());
          }
        }
        break;
      case cmStateEnums::MODULE_LIBRARY:
        libraryGenerator = createInstallGenerator(
          target, libraryArgs, helper.GetLibraryDestination(&libraryArgs));
        if (runtimeDependencySet) {
          runtimeDependencySet->AddModule(libraryGenerator.get());
        }
        break;
      case cmStateEnums::EXECUTABLE:
        if (target.IsAppBundleOnApple()) {
          if (bundleArgs.GetDestination().empty()) {
            status.SetError(
              cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given no BUNDLE "
                       "DESTINATION for MACOSX_BUNDLE executable target \"",
                       target.GetName(), "\"."));
            return false;
          }
          bundleGenerator = createInstallGenerator(
            target, bundleArgs, bundleArgs.GetDestination());
          if (runtimeDependencySet) {
            if (!AddBundleExecutable(helper, runtimeDependencySet,
                                     bundleGenerator.get())) {
              return false;
            }
          }
        } else {
          runtimeGenerator = createInstallGenerator(
            target, runtimeArgs, helper.GetRuntimeDestination(&runtimeArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddExecutable(runtimeGenerator.get());
          }
        }
        break;
      default:
        assert(false && "This should never happen");
        break;
    }

    // Keep track of whether we're installing anything in each category
    installsLibrary = installsLibrary || libraryGenerator;
    installsRuntime = installsRuntime || runtimeGenerator;
    installsFramework = installsFramework || frameworkGenerator;
    installsBundle = installsBundle || bundleGenerator;

    helper.Makefile->AddInstallGenerator(std::move(libraryGenerator));
    helper.Makefile->AddInstallGenerator(std::move(runtimeGenerator));
    helper.Makefile->AddInstallGenerator(std::move(frameworkGenerator));
    helper.Makefile->AddInstallGenerator(std::move(bundleGenerator));
  }

  // Tell the global generator about any installation component names
  // specified
  if (installsLibrary) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      libraryArgs.GetComponent());
  }
  if (installsRuntime) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      runtimeArgs.GetComponent());
  }
  if (installsFramework) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      frameworkArgs.GetComponent());
  }
  if (installsBundle) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      bundleArgs.GetComponent());
  }

  return true;
}